

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O3

void __thiscall
ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test::TestBody
          (ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  ParserPtr parser;
  long *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  long local_60 [2];
  AssertHelper local_50 [8];
  char *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"modelflattening/SN_to_cAMP/SN_to_cAMP.cellml","");
  fileContents((string *)&local_98);
  libcellml::Parser::parseModel((string *)&local_48);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_38,0));
  local_70 = (long *)0x0;
  local_a8 = (long *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(0)","parser->errorCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_a8);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x775,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_70 = (long *)CONCAT71(local_70._1_7_,cVar2);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_98,(char *)&local_70,"model->hasUnresolvedImports()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x776,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"modelflattening/SN_to_cAMP","");
  resourcePath((string *)&local_98);
  libcellml::Importer::resolveImports(local_38,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_70 = (long *)(CONCAT71(local_70._1_7_,cVar2) ^ 1);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_98,(char *)&local_70,"model->hasUnresolvedImports()","true"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77a,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::flattenModel((shared_ptr *)&local_98);
  this_00 = p_Stack_40;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length;
  local_48 = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
    }
  }
  local_70 = (long *)0x1;
  local_a8 = (long *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(1)","importer->errorCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_a8);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Logger::error((ulong)&local_a8);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[32],std::__cxx11::string>
            ((internal *)&local_70,"\"The model is not fully defined.\"",
             "importer->error(0)->description()",(char (*) [32])"The model is not fully defined.",
             &local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_70._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_98._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(ModelFlattening, modelWithCnUnitsNotDefinedInImportedComponent)
{
    auto parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("modelflattening/SN_to_cAMP/SN_to_cAMP.cellml"));
    auto importer = libcellml::Importer::create(false);

    EXPECT_EQ(size_t(0), parser->errorCount());
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("modelflattening/SN_to_cAMP"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ("The model is not fully defined.", importer->error(0)->description());
}